

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

char * xe::stripLeadingWhitespace(char *str)

{
  bool bVar1;
  int local_14;
  int whitespaceCount;
  char *str_local;
  
  local_14 = 0;
  while( true ) {
    bVar1 = false;
    if ((((str[local_14] != '\0') && (bVar1 = true, str[local_14] != ' ')) &&
        (bVar1 = true, str[local_14] != '\t')) && (bVar1 = true, str[local_14] != '\r')) {
      bVar1 = str[local_14] == '\n';
    }
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  return str + local_14;
}

Assistant:

static const char* stripLeadingWhitespace (const char* str)
{
	int whitespaceCount = 0;

	while (str[whitespaceCount]	!= 0	&&
		   (str[whitespaceCount] == ' '		||
			str[whitespaceCount] == '\t'	||
			str[whitespaceCount] == '\r'	||
			str[whitespaceCount] == '\n'))
		whitespaceCount += 1;

	return str + whitespaceCount;
}